

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

iterator * __thiscall
google::
sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
::find<HashObject<16,16>>
          (iterator *__return_storage_ptr__,
          sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
          *this,HashObject<16,_16> *key)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  nonempty_iterator local_68;
  nonempty_iterator local_48;
  
  if (*(long *)(this + 0x58) != *(long *)(this + 0x30)) {
    pVar1 = find_position<HashObject<16,16>>(this,key);
    if (pVar1.first != 0xffffffffffffffff) {
      sparsetable<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::get_iter(&local_48,
                 (sparsetable<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                  *)(this + 0x38),pVar1.first);
      sparsetable<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::nonempty_end(&local_68,
                     (sparsetable<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                      *)(this + 0x38));
      (__return_storage_ptr__->end).row_current._M_current = local_68.row_current._M_current;
      (__return_storage_ptr__->end).col_current = local_68.col_current;
      (__return_storage_ptr__->end).row_begin._M_current = local_68.row_begin._M_current;
      (__return_storage_ptr__->end).row_end._M_current = local_68.row_end._M_current;
      (__return_storage_ptr__->pos).row_begin._M_current = local_48.row_begin._M_current;
      (__return_storage_ptr__->pos).row_end._M_current = local_48.row_end._M_current;
      (__return_storage_ptr__->pos).row_current._M_current = local_48.row_current._M_current;
      (__return_storage_ptr__->pos).col_current = local_48.col_current;
      __return_storage_ptr__->ht =
           (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)this;
      sparse_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::advance_past_deleted(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::end(__return_storage_ptr__,
        (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
         *)this);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table.get_iter(pos.first), table.nonempty_end());
  }